

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileWhile(jx9_gen_state *pGen)

{
  sxu32 nLine;
  sxi32 sVar1;
  sxi32 sVar2;
  SyToken *pSVar3;
  GenBlock **ppBlock;
  SyToken *pSVar4;
  SyToken *pSVar5;
  GenBlock *pWhileBlock;
  SyToken *pEnd;
  sxu32 nFalseJump;
  
  pWhileBlock = (GenBlock *)0x0;
  pEnd = (SyToken *)0x0;
  pSVar3 = pGen->pIn;
  nLine = pSVar3->nLine;
  pGen->pIn = pSVar3 + 1;
  if ((pSVar3 + 1 < pGen->pEnd) && ((pSVar3[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar3 + 2;
    sVar2 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&pWhileBlock);
    sVar1 = -10;
    if (sVar2 == 0) {
      jx9DelimitNestedTokens(pGen->pIn,pGen->pEnd,0x200,0x400,&pEnd);
      pSVar3 = pEnd;
      if ((pGen->pIn == pEnd) || (pSVar5 = pGen->pEnd, pSVar5 <= pEnd)) {
        sVar2 = jx9GenCompileError(pGen,1,nLine,"Expected expression after \'while\' keyword");
        if (sVar2 == -10) {
          return -10;
        }
        pSVar5 = pGen->pEnd;
      }
      pGen->pEnd = pSVar3;
      sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar2 != -10) {
        pSVar4 = pGen->pIn;
        while (pSVar4 < pSVar3) {
          sVar2 = jx9GenCompileError(pGen,1,pSVar4->nLine,"Unexpected token \'%z\'");
          if (sVar2 == -10) {
            return -10;
          }
          pSVar4 = pGen->pIn + 1;
          pGen->pIn = pSVar4;
        }
        pGen->pIn = pSVar3 + 1;
        pGen->pEnd = pSVar5;
        jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&nFalseJump);
        GenStateNewJumpFixup(pWhileBlock,9,nFalseJump);
        sVar2 = jx9CompileBlock(pGen);
        if (sVar2 != -10) {
          jx9VmEmitInstr(pGen->pVm,8,0,pWhileBlock->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
          ppBlock = (GenBlock **)0xffffffffffffffff;
          GenStateFixJumps(pWhileBlock,-1,pGen->pVm->pByteContainer->nUsed);
          GenStateLeaveBlock(pGen,ppBlock);
          sVar1 = 0;
        }
      }
    }
  }
  else {
    sVar1 = jx9GenCompileError(pGen,1,nLine,"Expected \'(\' after \'while\' keyword");
    if (sVar1 == -10) {
      sVar1 = -10;
    }
    else {
      pSVar3 = pGen->pIn;
      while ((sVar1 = 0, pSVar3 < pGen->pEnd && (sVar1 = 0, (pSVar3->nType & 0x40040) == 0))) {
        pSVar3 = pSVar3 + 1;
        pGen->pIn = pSVar3;
      }
    }
  }
  return sVar1;
}

Assistant:

static sxi32 jx9CompileWhile(jx9_gen_state *pGen)
{ 
	GenBlock *pWhileBlock = 0;
	SyToken *pTmp, *pEnd = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'while' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pWhileBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	/* Synchronize pointers */
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	/* Emit the false jump */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pWhileBlock, JX9_OP_JZ, nFalseJump);
	/* Compile the loop body */
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pWhileBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pWhileBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}